

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O0

CommandOptions * write_aux_data_file(CommandOptions *Options)

{
  int iVar1;
  ui32_t uVar2;
  byte_t *__src;
  AESEncContext *this;
  HMACContext *this_00;
  _IO_FILE *extraout_RDX;
  CommandOptions *in_RSI;
  bool bVar3;
  Result_t local_530 [104];
  FrameBuffer local_4c8 [2];
  FrameBuffer local_460 [2];
  Result_t local_3f8 [108];
  uint local_38c;
  string local_388 [4];
  ui32_t duration;
  Result_t local_320 [104];
  Result_t local_2b8 [104];
  Result_t local_250 [111];
  FortunaRNG local_1e1;
  undefined1 local_1e0 [7];
  FortunaRNG RNG;
  WriterInfo Info;
  DCDataDescriptor local_128 [2];
  undefined1 local_b9;
  undefined1 local_b8 [8];
  byte_t IV_buf [16];
  SequenceParser Parser;
  undefined1 local_98 [8];
  DCDataDescriptor DDesc;
  undefined1 local_60 [8];
  FrameBuffer FrameBuffer;
  MXFWriter Writer;
  HMACContext *HMAC;
  AESEncContext *Context;
  CommandOptions *Options_local;
  Result_t *result;
  
  ASDCP::DCData::MXFWriter::MXFWriter((MXFWriter *)&FrameBuffer.field_0x20);
  ASDCP::DCData::FrameBuffer::FrameBuffer((FrameBuffer *)local_60,in_RSI->fb_size);
  ASDCP::DCData::DCDataDescriptor::DCDataDescriptor((DCDataDescriptor *)local_98);
  ASDCP::DCData::SequenceParser::SequenceParser((SequenceParser *)(IV_buf + 8));
  local_b9 = 0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::front(&in_RSI->filenames);
  ASDCP::DCData::SequenceParser::OpenRead((string *)Options);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if (-1 < iVar1) {
    ASDCP::DCData::SequenceParser::FillDCDataDescriptor(local_128);
    Kumu::Result_t::~Result_t((Result_t *)local_128);
    __src = Kumu::Identifier<16U>::Value(&(in_RSI->aux_data_coding).super_Identifier<16U>);
    uVar2 = Kumu::Identifier<16U>::Size(&(in_RSI->aux_data_coding).super_Identifier<16U>);
    memcpy(DDesc.AssetID + 8,__src,(ulong)uVar2);
    Info._168_8_ = CommandOptions::PictureRate(in_RSI);
    local_98 = (undefined1  [8])Info._168_8_;
    if ((in_RSI->verbose_flag & 1U) != 0) {
      fprintf(_stderr,"Aux Data\n");
      fprintf(_stderr,"Frame Buffer size: %u\n",(ulong)in_RSI->fb_size);
      ASDCP::DCData::DCDataDescriptorDump((DCData *)local_98,(DCDataDescriptor *)0x0,extraout_RDX);
    }
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if ((-1 < iVar1) && ((in_RSI->no_write_flag & 1U) == 0)) {
    ASDCP::WriterInfo::WriterInfo((WriterInfo *)local_1e0,&s_MyInfo.super_WriterInfo);
    if ((in_RSI->asset_id_flag & 1U) == 0) {
      Kumu::GenRandomUUID(Info.ProductUUID + 8);
    }
    else {
      Info.ProductUUID._8_8_ = *(undefined8 *)in_RSI->asset_id_value;
      Info.AssetUUID._0_8_ = *(undefined8 *)(in_RSI->asset_id_value + 8);
    }
    Info.ProductName.field_2._8_4_ = 2;
    if ((in_RSI->key_flag & 1U) != 0) {
      Kumu::FortunaRNG::FortunaRNG(&local_1e1);
      Kumu::GenRandomUUID(Info.AssetUUID + 8);
      Info.CryptographicKeyID[8] = '\x01';
      if ((in_RSI->key_id_flag & 1U) == 0) {
        create_random_uuid(Info.ContextID + 8);
      }
      else {
        Info.ContextID._8_8_ = *(undefined8 *)in_RSI->key_id_value;
        Info.CryptographicKeyID._0_8_ = *(undefined8 *)(in_RSI->key_id_value + 8);
      }
      this = (AESEncContext *)operator_new(8);
      ASDCP::AESEncContext::AESEncContext(this);
      ASDCP::AESEncContext::InitKey((uchar *)local_250);
      Kumu::Result_t::operator=((Result_t *)Options,local_250);
      Kumu::Result_t::~Result_t(local_250);
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar1) {
        Kumu::FortunaRNG::FillRandom((uchar *)&local_1e1,(uint)local_b8);
        ASDCP::AESEncContext::SetIVec((uchar *)local_2b8);
        Kumu::Result_t::operator=((Result_t *)Options,local_2b8);
        Kumu::Result_t::~Result_t(local_2b8);
      }
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if ((-1 < iVar1) && ((in_RSI->write_hmac & 1U) != 0)) {
        Info.CryptographicKeyID[9] = '\x01';
        this_00 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_00);
        ASDCP::HMACContext::InitKey((uchar *)local_320,(LabelSet_t)this_00);
        Kumu::Result_t::operator=((Result_t *)Options,local_320);
        Kumu::Result_t::~Result_t(local_320);
      }
      Kumu::FortunaRNG::~FortunaRNG(&local_1e1);
    }
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if (-1 < iVar1) {
      ASDCP::DCData::MXFWriter::OpenWrite
                (local_388,(WriterInfo *)&FrameBuffer.field_0x20,
                 (DCDataDescriptor *)&in_RSI->out_file,(uint)local_1e0);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_388);
      Kumu::Result_t::~Result_t((Result_t *)local_388);
    }
    ASDCP::WriterInfo::~WriterInfo((WriterInfo *)local_1e0);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if (-1 < iVar1) {
    local_38c = 0;
    ASDCP::DCData::SequenceParser::Reset();
    Kumu::Result_t::operator=((Result_t *)Options,local_3f8);
    Kumu::Result_t::~Result_t(local_3f8);
    while( true ) {
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      bVar3 = false;
      if (-1 < iVar1) {
        bVar3 = local_38c < in_RSI->duration;
        local_38c = local_38c + 1;
      }
      if (!bVar3) break;
      ASDCP::DCData::SequenceParser::ReadFrame(local_460);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_460);
      Kumu::Result_t::~Result_t((Result_t *)local_460);
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar1) {
        if ((in_RSI->verbose_flag & 1U) != 0) {
          ASDCP::DCData::FrameBuffer::Dump((_IO_FILE *)local_60,(uint)_stderr);
        }
        if ((in_RSI->encrypt_header_flag & 1U) != 0) {
          ASDCP::FrameBuffer::PlaintextOffset((FrameBuffer *)local_60,0);
        }
      }
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if ((-1 < iVar1) && ((in_RSI->no_write_flag & 1U) == 0)) {
        ASDCP::DCData::MXFWriter::WriteFrame
                  (local_4c8,(AESEncContext *)&FrameBuffer.field_0x20,(HMACContext *)local_60);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_4c8);
        Kumu::Result_t::~Result_t((Result_t *)local_4c8);
      }
    }
    bVar3 = Kumu::Result_t::operator==((Result_t *)Options,(Result_t *)Kumu::RESULT_ENDOFFILE);
    if (bVar3) {
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
    }
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if ((-1 < iVar1) && ((in_RSI->no_write_flag & 1U) == 0)) {
    ASDCP::DCData::MXFWriter::Finalize();
    Kumu::Result_t::operator=((Result_t *)Options,local_530);
    Kumu::Result_t::~Result_t(local_530);
  }
  local_b9 = 1;
  ASDCP::DCData::SequenceParser::~SequenceParser((SequenceParser *)(IV_buf + 8));
  ASDCP::DCData::FrameBuffer::~FrameBuffer((FrameBuffer *)local_60);
  ASDCP::DCData::MXFWriter::~MXFWriter((MXFWriter *)&FrameBuffer.field_0x20);
  return Options;
}

Assistant:

Result_t
write_aux_data_file(CommandOptions& Options)
{
  AESEncContext*          Context = 0;
  HMACContext*            HMAC = 0;
  DCData::MXFWriter       Writer;
  DCData::FrameBuffer     FrameBuffer(Options.fb_size);
  DCData::DCDataDescriptor DDesc;
  DCData::SequenceParser  Parser;
  byte_t                  IV_buf[CBC_BLOCK_SIZE];

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
  {
    Parser.FillDCDataDescriptor(DDesc);
    memcpy(DDesc.DataEssenceCoding, Options.aux_data_coding.Value(), Options.aux_data_coding.Size());
    DDesc.EditRate = Options.PictureRate();

    if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Aux Data\n");
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	  DCData::DCDataDescriptorDump(DDesc);
	}
  }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
  {
    WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
    if ( Options.asset_id_flag )
      memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
    else
      Kumu::GenRandomUUID(Info.AssetUUID);

    Info.LabelSetType = LS_MXF_SMPTE;

#ifdef HAVE_OPENSSL
      // configure encryption
    if( Options.key_flag )
	{
      Kumu::FortunaRNG        RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
      {
        Info.UsesHMAC = true;
        HMAC = new HMACContext;
        result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
      }
	}
#endif // HAVE_OPENSSL

    if ( ASDCP_SUCCESS(result) )
      result = Writer.OpenWrite(Options.out_file, Info, DDesc);
  }

  if ( ASDCP_SUCCESS(result) )
  {
    ui32_t duration = 0;
    result = Parser.Reset();

    while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
      result = Parser.ReadFrame(FrameBuffer);

      if ( ASDCP_SUCCESS(result) )
      {
        if ( Options.verbose_flag )
          FrameBuffer.Dump(stderr, Options.fb_dump_size);

        if ( Options.encrypt_header_flag )
          FrameBuffer.PlaintextOffset(0);
      }

      if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
      {
        result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

        // The Writer class will forward the last block of ciphertext
        // to the encryption context for use as the IV for the next
        // frame. If you want to use non-sequitur IV values, un-comment
        // the following  line of code.
        // if ( ASDCP_SUCCESS(result) && Options.key_flag )
        //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
      }
	}

    if ( result == RESULT_ENDOFFILE )
      result = RESULT_OK;
  }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}